

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

NumericExpr __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_SparsityPrinter>
::ReadNumericExpr(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_SparsityPrinter>
                  *this,int opcode)

{
  Reference RVar1;
  int in_ESI;
  undefined8 *in_RDI;
  SymbolicArgHandler args_4;
  int num_args_3;
  NumberOfArgHandler args_3;
  int num_args_2;
  NumericArgHandler args_2;
  int num_args_1;
  VarArgHandler args_1;
  int num_args;
  int i;
  PLTermHandler pl_handler;
  int num_slopes;
  NumericExpr else_expr;
  NumericExpr then_expr;
  LogicalExpr condition;
  BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_SparsityPrinter>::NumericExprReader>
  args;
  Kind kind;
  OpCodeInfo *info;
  double in_stack_ffffffffffffff28;
  bool ignore_zero;
  undefined1 ignore_zero_00;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_SparsityPrinter>
  *in_stack_ffffffffffffff30;
  NumericExpr in_stack_ffffffffffffff38;
  Kind in_stack_ffffffffffffff3c;
  int iVar2;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_SparsityPrinter>
  *in_stack_ffffffffffffff40;
  NumericExpr else_expr_00;
  ArgHandler *arg_handler;
  NumericExpr in_stack_ffffffffffffff48;
  Kind in_stack_ffffffffffffff4c;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_SparsityPrinter>
  *in_stack_ffffffffffffff50;
  NLHandler<mp::NullNLHandler<int>,_int> *pNVar3;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_SparsityPrinter>
  *in_stack_ffffffffffffff58;
  BinaryReaderBase *this_00;
  CStringRef in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  BasicCStringRef<char> local_80 [2];
  int local_70;
  int local_68;
  int local_60;
  int local_58;
  int local_50;
  BasicCStringRef<char> local_48;
  int local_3c;
  NumericExpr local_38;
  NumericExpr local_34;
  LogicalExpr local_30;
  Kind local_24;
  OpCodeInfo *local_20;
  NumericExpr local_4;
  
  local_20 = GetOpCodeInfo(in_ESI);
  local_24 = local_20->kind;
  switch(local_20->first_kind) {
  case FIRST_UNARY:
    ReadNumericExpr(in_stack_ffffffffffffff30,SUB81((ulong)in_stack_ffffffffffffff28 >> 0x38,0));
    local_4 = NLHandler<mp::NullNLHandler<int>,_int>::OnUnary
                        ((NLHandler<mp::NullNLHandler<int>,_int> *)in_stack_ffffffffffffff40,
                         in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
    break;
  default:
    fmt::BasicCStringRef<char>::BasicCStringRef(local_80,"expected numeric expression opcode");
    BinaryReaderBase::ReportError<>
              ((BinaryReaderBase *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff60);
    local_4 = 0;
    break;
  case ADD:
    BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_SparsityPrinter>::NumericExprReader>
    ::BinaryArgReader((BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_SparsityPrinter>::NumericExprReader>
                       *)in_stack_ffffffffffffff40,
                      (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_SparsityPrinter>
                       *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    local_4 = NLHandler<mp::NullNLHandler<int>,_int>::OnBinary
                        ((NLHandler<mp::NullNLHandler<int>,_int> *)in_stack_ffffffffffffff50,
                         in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,
                         (NumericExpr)((ulong)in_stack_ffffffffffffff40 >> 0x20));
    break;
  case IF:
    local_30 = ReadLogicalExpr(in_stack_ffffffffffffff58);
    else_expr_00 = (NumericExpr)((ulong)in_stack_ffffffffffffff40 >> 0x20);
    ignore_zero = SUB81((ulong)in_stack_ffffffffffffff28 >> 0x38,0);
    local_34 = ReadNumericExpr(in_stack_ffffffffffffff30,ignore_zero);
    local_38 = ReadNumericExpr(in_stack_ffffffffffffff30,ignore_zero);
    local_4 = NLHandler<mp::NullNLHandler<int>,_int>::OnIf
                        ((NLHandler<mp::NullNLHandler<int>,_int> *)in_stack_ffffffffffffff50,
                         in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,else_expr_00);
    break;
  case PLTERM:
    local_3c = BinaryReader<mp::internal::IdentityConverter>::ReadUInt
                         ((BinaryReader<mp::internal::IdentityConverter> *)in_stack_ffffffffffffff40
                         );
    if (local_3c < 2) {
      this_00 = (BinaryReaderBase *)*in_RDI;
      fmt::BasicCStringRef<char>::BasicCStringRef
                (&local_48,"too few slopes in piecewise-linear term");
      BinaryReaderBase::ReportError<>(this_00,in_stack_ffffffffffffff60);
    }
    BinaryReaderBase::ReadTillEndOfLine((BinaryReaderBase *)*in_RDI);
    NLHandler<mp::NullNLHandler<int>,_int>::BeginPLTerm
              ((NLHandler<mp::NullNLHandler<int>,_int> *)in_stack_ffffffffffffff30,
               (int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    for (local_50 = 0; local_50 < local_3c + -1; local_50 = local_50 + 1) {
      ReadConstant(in_stack_ffffffffffffff30);
      NLHandler<mp::NullNLHandler<int>,_int>::PLTermHandler::AddSlope
                ((PLTermHandler *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      ReadConstant(in_stack_ffffffffffffff30);
      NLHandler<mp::NullNLHandler<int>,_int>::PLTermHandler::AddBreakpoint
                ((PLTermHandler *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    }
    ReadConstant(in_stack_ffffffffffffff30);
    NLHandler<mp::NullNLHandler<int>,_int>::PLTermHandler::AddSlope
              ((PLTermHandler *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    pNVar3 = (NLHandler<mp::NullNLHandler<int>,_int> *)in_RDI[2];
    RVar1 = ReadReference(in_stack_ffffffffffffff40);
    local_4 = NLHandler<mp::NullNLHandler<int>,_int>::EndPLTerm(pNVar3,RVar1);
    break;
  case FIRST_ITERATED:
    local_58 = ReadNumArgs(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    NLHandler<mp::NullNLHandler<int>,_int>::BeginVarArg
              ((NLHandler<mp::NullNLHandler<int>,_int> *)in_stack_ffffffffffffff30,
               (Kind)((ulong)in_stack_ffffffffffffff28 >> 0x20),SUB84(in_stack_ffffffffffffff28,0));
    NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,SparsityPrinter>::
    ReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,SparsityPrinter>::NumericExprReader,mp::NLHandler<mp::NullNLHandler<int>,int>::ArgHandler>
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
               (ArgHandler *)in_stack_ffffffffffffff30);
    local_4 = NLHandler<mp::NullNLHandler<int>,_int>::EndVarArg
                        ((NLHandler<mp::NullNLHandler<int>,_int> *)in_RDI[2]);
    break;
  case SUM:
    local_60 = ReadNumArgs(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    NLHandler<mp::NullNLHandler<int>,_int>::BeginSum
              ((NLHandler<mp::NullNLHandler<int>,_int> *)in_stack_ffffffffffffff30,
               (int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,SparsityPrinter>::
    ReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,SparsityPrinter>::NumericExprReader,mp::NLHandler<mp::NullNLHandler<int>,int>::ArgHandler>
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
               (ArgHandler *)in_stack_ffffffffffffff30);
    local_4 = NLHandler<mp::NullNLHandler<int>,_int>::EndSum
                        ((NLHandler<mp::NullNLHandler<int>,_int> *)in_RDI[2]);
    break;
  case LAST_ITERATED:
    local_68 = ReadNumArgs(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    ignore_zero_00 = (undefined1)((ulong)in_stack_ffffffffffffff28 >> 0x38);
    BinaryReaderBase::ReadTillEndOfLine((BinaryReaderBase *)*in_RDI);
    arg_handler = (ArgHandler *)in_RDI[2];
    iVar2 = local_68;
    ReadNumericExpr(in_stack_ffffffffffffff30,(bool)ignore_zero_00);
    NLHandler<mp::NullNLHandler<int>,_int>::BeginNumberOf
              ((NLHandler<mp::NullNLHandler<int>,_int> *)arg_handler,in_stack_ffffffffffffff3c,
               in_stack_ffffffffffffff38);
    NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,SparsityPrinter>::
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,SparsityPrinter>::NumericExprReader,mp::NLHandler<mp::NullNLHandler<int>,int>::ArgHandler>
              (in_stack_ffffffffffffff50,iVar2,arg_handler);
    local_4 = NLHandler<mp::NullNLHandler<int>,_int>::EndNumberOf
                        ((NLHandler<mp::NullNLHandler<int>,_int> *)in_RDI[2]);
    break;
  case NUMBEROF_SYM:
    local_70 = ReadNumArgs(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    BinaryReaderBase::ReadTillEndOfLine((BinaryReaderBase *)*in_RDI);
    iVar2 = local_70;
    ReadSymbolicExpr((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_SparsityPrinter>
                      *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    NLHandler<mp::NullNLHandler<int>,_int>::BeginSymbolicNumberOf
              ((NLHandler<mp::NullNLHandler<int>,_int> *)in_stack_ffffffffffffff40,iVar2,
               in_stack_ffffffffffffff38);
    NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,SparsityPrinter>::
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,SparsityPrinter>::SymbolicExprReader,mp::NLHandler<mp::NullNLHandler<int>,int>::ArgHandler>
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
               (ArgHandler *)in_stack_ffffffffffffff40);
    local_4 = NLHandler<mp::NullNLHandler<int>,_int>::EndSymbolicNumberOf
                        ((NLHandler<mp::NullNLHandler<int>,_int> *)in_RDI[2]);
    break;
  case COUNT:
    local_4 = ReadCountExpr(in_stack_ffffffffffffff30);
  }
  return local_4;
}

Assistant:

typename Handler::NumericExpr
    NLReader<Reader, Handler>::ReadNumericExpr(int opcode) {
  const internal::OpCodeInfo &info = internal::GetOpCodeInfo(opcode);
  expr::Kind kind = info.kind;
  switch (info.first_kind) {
  case expr::FIRST_UNARY:
    return handler_.OnUnary(kind, ReadNumericExpr());
  case expr::FIRST_BINARY: {
    BinaryArgReader<> args(*this);
    return handler_.OnBinary(kind, args.lhs, args.rhs);
  }
  case expr::IF: {
    LogicalExpr condition = ReadLogicalExpr();
    NumericExpr then_expr = ReadNumericExpr();
    NumericExpr else_expr = ReadNumericExpr();
    return handler_.OnIf(condition, then_expr, else_expr);
  }
  case expr::PLTERM: {
    // Read a piecewise-linear term.
    int num_slopes = reader_.ReadUInt();
    if (num_slopes <= 1)
      reader_.ReportError("too few slopes in piecewise-linear term");
    reader_.ReadTillEndOfLine();
    typename Handler::PLTermHandler pl_handler =
        handler_.BeginPLTerm(num_slopes - 1);
    for (int i = 0; i < num_slopes - 1; ++i) {
      pl_handler.AddSlope(ReadConstant());
      pl_handler.AddBreakpoint(ReadConstant());
    }
    pl_handler.AddSlope(ReadConstant());
    return handler_.EndPLTerm(pl_handler, ReadReference());
  }
  case expr::FIRST_VARARG: {
    // Read a vararg expression (min or max).
    int num_args = ReadNumArgs(1);
    typename Handler::VarArgHandler args = handler_.BeginVarArg(kind, num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndVarArg(args);
  }
  case expr::SUM: {
    int num_args = ReadNumArgs();
    typename Handler::NumericArgHandler args = handler_.BeginSum(num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndSum(args);
  }
  case expr::COUNT:
    return ReadCountExpr();
  case expr::NUMBEROF: {
    // Read a numberof expression.
    int num_args = ReadNumArgs(1);
    reader_.ReadTillEndOfLine();
    typename Handler::NumberOfArgHandler args =
        handler_.BeginNumberOf(num_args, ReadNumericExpr());
    DoReadArgs<NumericExprReader>(num_args - 1, args);
    return handler_.EndNumberOf(args);
  }
  case expr::NUMBEROF_SYM: {
    // Read a symbolic numberof expression.
    int num_args = ReadNumArgs(1);
    reader_.ReadTillEndOfLine();
    typename Handler::SymbolicArgHandler args =
        handler_.BeginSymbolicNumberOf(num_args, ReadSymbolicExpr());
    DoReadArgs<SymbolicExprReader>(num_args - 1, args);
    return handler_.EndSymbolicNumberOf(args);
  }
  default:
    reader_.ReportError("expected numeric expression opcode");
  }
  return NumericExpr();
}